

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int send_certificate_and_certificate_verify
              (ptls_t *tls,ptls_message_emitter_t *emitter,
              st_ptls_signature_algorithms_t *signature_algorithms,ptls_iovec_t context,
              char *context_string,int push_status_request,uint16_t *compress_algos,
              size_t num_compress_algos)

{
  ptls_buffer_t *buf;
  ptls_key_schedule_t *ppVar1;
  ptls_buffer_t *buf_00;
  st_ptls_sign_certificate_t *psVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  ptls_hash_context_t **pppVar6;
  size_t sVar7;
  ptls_emit_certificate_t *ppVar8;
  size_t sVar9;
  uint8_t *puVar10;
  ptls_message_emitter_t *_emitter;
  bool bVar11;
  ptls_iovec_t pVar12;
  uint16_t algo;
  size_t local_150;
  size_t local_148;
  size_t local_140;
  size_t local_138;
  ptls_key_schedule_t *local_130;
  char *local_128;
  st_ptls_signature_algorithms_t *local_120;
  uint8_t data [226];
  
  if (signature_algorithms->count == 0) {
    iVar3 = 0x6d;
  }
  else {
    ppVar8 = tls->ctx->emit_certificate;
    local_128 = context_string;
    local_120 = signature_algorithms;
    if (ppVar8 == (ptls_emit_certificate_t *)0x0) {
      ppVar8 = &send_certificate_and_certificate_verify::default_emit_certificate;
    }
    while( true ) {
      iVar3 = (*ppVar8->cb)(ppVar8,tls,emitter,tls->key_schedule,context,push_status_request,
                            compress_algos,num_compress_algos);
      if (iVar3 != 0x20a) break;
      bVar11 = ppVar8 == &send_certificate_and_certificate_verify::default_emit_certificate;
      ppVar8 = &send_certificate_and_certificate_verify::default_emit_certificate;
      if (bVar11) {
        __assert_fail("emit_certificate != &default_emit_certificate",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                      ,0xa41,
                      "int send_certificate_and_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, ptls_iovec_t, const char *, int, const uint16_t *, size_t)"
                     );
      }
    }
    if (iVar3 == 0) {
      if (tls->ctx->sign_certificate == (ptls_sign_certificate_t *)0x0) {
        iVar3 = 0;
      }
      else {
        iVar3 = (*emitter->begin_message)(emitter);
        if (iVar3 == 0) {
          buf = emitter->buf;
          ppVar1 = tls->key_schedule;
          sVar7 = buf->off;
          iVar3 = ptls_buffer_reserve(buf,1);
          if (iVar3 == 0) {
            buf->base[buf->off] = '\x0f';
            buf->off = buf->off + 1;
            iVar3 = ptls_buffer_reserve(buf,3);
            if (iVar3 == 0) {
              puVar10 = buf->base;
              sVar9 = buf->off;
              puVar10[sVar9 + 2] = '\0';
              puVar10 = puVar10 + sVar9;
              puVar10[0] = '\0';
              puVar10[1] = '\0';
              sVar9 = buf->off;
              buf->off = sVar9 + 3;
              buf_00 = emitter->buf;
              local_138 = buf_00->off;
              local_140 = sVar7;
              local_130 = ppVar1;
              iVar3 = ptls_buffer_reserve(buf_00,2);
              if (iVar3 == 0) {
                puVar10 = buf_00->base;
                sVar7 = buf_00->off;
                (puVar10 + sVar7)[0] = '\0';
                (puVar10 + sVar7)[1] = '\0';
                buf_00->off = buf_00->off + 2;
                local_148 = sVar9 + 3;
                iVar3 = ptls_buffer_reserve(buf_00,2);
                if (iVar3 == 0) {
                  puVar10 = buf_00->base;
                  sVar7 = buf_00->off;
                  (puVar10 + sVar7)[0] = '\0';
                  (puVar10 + sVar7)[1] = '\0';
                  sVar7 = buf_00->off;
                  local_150 = sVar7 + 2;
                  buf_00->off = local_150;
                  sVar4 = build_certificate_verify_signdata(data,tls->key_schedule,local_128);
                  psVar2 = tls->ctx->sign_certificate;
                  pVar12.len = sVar4;
                  pVar12.base = data;
                  iVar3 = (*psVar2->cb)(psVar2,tls,&algo,buf_00,pVar12,local_120->list,
                                        local_120->count);
                  ppVar1 = local_130;
                  if (iVar3 == 0) {
                    buf_00->base[local_138] = algo._1_1_;
                    buf_00->base[local_138 + 1] = (uint8_t)algo;
                    lVar5 = buf_00->off - local_150;
                    buf_00->base[sVar7] = (uint8_t)((ulong)lVar5 >> 8);
                    buf_00->base[sVar7 + 1] = (uint8_t)lVar5;
                    sVar7 = buf->off;
                    lVar5 = 0x10;
                    do {
                      buf->base[sVar9] = (uint8_t)(sVar7 - local_148 >> ((byte)lVar5 & 0x3f));
                      lVar5 = lVar5 + -8;
                      sVar9 = sVar9 + 1;
                    } while (lVar5 != -8);
                    if ((local_130 != (ptls_key_schedule_t *)0x0) && (local_130->num_hashes != 0)) {
                      puVar10 = buf->base + local_140;
                      sVar9 = buf->off - local_140;
                      pppVar6 = &local_130->hashes[0].ctx;
                      sVar7 = 0;
                      do {
                        (*(*pppVar6)->update)(*pppVar6,puVar10,sVar9);
                        sVar7 = sVar7 + 1;
                        pppVar6 = pppVar6 + 2;
                      } while (sVar7 != ppVar1->num_hashes);
                    }
                    iVar3 = (*emitter->commit_message)(emitter);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int send_certificate_and_certificate_verify(ptls_t *tls, ptls_message_emitter_t *emitter,
                                                   struct st_ptls_signature_algorithms_t *signature_algorithms,
                                                   ptls_iovec_t context, const char *context_string, int push_status_request,
                                                   const uint16_t *compress_algos, size_t num_compress_algos)
{
    int ret;

    if (signature_algorithms->count == 0) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }

    { /* send Certificate (or the equivalent) */
        static ptls_emit_certificate_t default_emit_certificate = {default_emit_certificate_cb};
        ptls_emit_certificate_t *emit_certificate =
            tls->ctx->emit_certificate != NULL ? tls->ctx->emit_certificate : &default_emit_certificate;
    Redo:
        if ((ret = emit_certificate->cb(emit_certificate, tls, emitter, tls->key_schedule, context, push_status_request,
                                        compress_algos, num_compress_algos)) != 0) {
            if (ret == PTLS_ERROR_DELEGATE) {
                assert(emit_certificate != &default_emit_certificate);
                emit_certificate = &default_emit_certificate;
                goto Redo;
            }
            goto Exit;
        }
    }

    /* build and send CertificateVerify */
    if (tls->ctx->sign_certificate != NULL) {
        ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY, {
            ptls_buffer_t *sendbuf = emitter->buf;
            size_t algo_off = sendbuf->off;
            ptls_buffer_push16(sendbuf, 0); /* filled in later */
            ptls_buffer_push_block(sendbuf, 2, {
                uint16_t algo;
                uint8_t data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
                size_t datalen = build_certificate_verify_signdata(data, tls->key_schedule, context_string);
                if ((ret = tls->ctx->sign_certificate->cb(tls->ctx->sign_certificate, tls, &algo, sendbuf,
                                                          ptls_iovec_init(data, datalen), signature_algorithms->list,
                                                          signature_algorithms->count)) != 0) {
                    goto Exit;
                }
                sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
                sendbuf->base[algo_off + 1] = (uint8_t)algo;
            });
        });
    }

Exit:
    return ret;
}